

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<Fad<float>_>::VerifySymmetry(TPZMatrix<Fad<float>_> *this,REAL tol)

{
  bool bVar1;
  Fad<float> *x;
  ostream *poVar2;
  TPZBaseMatrix *in_RDI;
  double in_XMM0_Qa;
  Fad<float> exp;
  int64_t j;
  int64_t i;
  int64_t ncols;
  int64_t nrows;
  Fad<float> *in_stack_fffffffffffffed0;
  Fad<float> *in_stack_ffffffffffffff00;
  Fad<float> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  undefined1 local_d8 [48];
  undefined1 local_a8 [32];
  undefined1 local_88 [80];
  long local_38;
  long local_30;
  int64_t local_28;
  long local_20;
  double local_18;
  int local_4;
  
  local_18 = in_XMM0_Qa;
  local_20 = TPZBaseMatrix::Rows(in_RDI);
  local_28 = TPZBaseMatrix::Cols(in_RDI);
  if (local_20 == local_28) {
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      for (local_38 = 0; local_38 <= local_30; local_38 = local_38 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_88,in_RDI,local_30,local_38);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_a8,in_RDI,local_38,local_30);
        operator-<Fad<float>,_Fad<float>,_nullptr>
                  (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                  ((Fad<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_ffffffffffffff08);
        FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffffed0);
        Fad<float>::~Fad(in_stack_fffffffffffffed0);
        Fad<float>::~Fad(in_stack_fffffffffffffed0);
        in_stack_ffffffffffffff14 = fabs<float>((Fad<float> *)0x131bbf8);
        bVar1 = local_18 < (double)in_stack_ffffffffffffff14;
        if (bVar1) {
          in_stack_ffffffffffffff08 =
               (Fad<float> *)std::operator<<((ostream *)&std::cout,"Elemento: ");
          in_stack_ffffffffffffff00 =
               (Fad<float> *)std::ostream::operator<<(in_stack_ffffffffffffff08,local_30);
          x = (Fad<float> *)std::operator<<((ostream *)in_stack_ffffffffffffff00,", ");
          poVar2 = (ostream *)std::ostream::operator<<(x,local_38);
          std::operator<<(poVar2,"  -> ");
          poVar2 = ::operator<<((ostream *)in_stack_ffffffffffffff00,x);
          std::operator<<(poVar2,"/");
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_d8,in_RDI,local_30,local_38);
          in_stack_fffffffffffffed0 =
               (Fad<float> *)::operator<<((ostream *)in_stack_ffffffffffffff00,x);
          std::ostream::operator<<(in_stack_fffffffffffffed0,std::endl<char,std::char_traits<char>>)
          ;
          Fad<float>::~Fad(in_stack_fffffffffffffed0);
          local_4 = 0;
        }
        Fad<float>::~Fad(in_stack_fffffffffffffed0);
        if (bVar1) {
          return local_4;
        }
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}